

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-visuals.c
# Opt level: O2

void ui_visuals_module_cleanup(void)

{
  visuals_cycle_group *p;
  visuals_cycler *p_00;
  visuals_flicker *p_01;
  visuals_color_cycle **p_02;
  visuals_cycle_group **p_03;
  ulong uVar1;
  ulong uVar2;
  
  p_01 = visuals_flicker_table;
  if (visuals_flicker_table != (visuals_flicker *)0x0) {
    if (visuals_flicker_table->cycles != (uint8_t *)0x0) {
      mem_free(visuals_flicker_table->cycles);
      p_01->cycles = (uint8_t *)0x0;
    }
    mem_free(p_01);
  }
  p_00 = visuals_cycler_table;
  if (visuals_cycler_table != (visuals_cycler *)0x0) {
    p_03 = visuals_cycler_table->groups;
    if (p_03 != (visuals_cycle_group **)0x0) {
      for (uVar2 = 0; uVar2 < p_00->max_groups; uVar2 = uVar2 + 1) {
        p = p_03[uVar2];
        if (p != (visuals_cycle_group *)0x0) {
          p_02 = p->cycles;
          if (p_02 != (visuals_color_cycle **)0x0) {
            for (uVar1 = 0; uVar1 < p->max_cycles; uVar1 = uVar1 + 1) {
              visuals_color_cycle_free(p_02[uVar1]);
              p_02 = p->cycles;
            }
            mem_free(p_02);
            p->cycles = (visuals_color_cycle **)0x0;
          }
          if (p->group_name != (char *)0x0) {
            string_free(p->group_name);
            p->group_name = (char *)0x0;
          }
          mem_free(p);
          p_03 = p_00->groups;
        }
      }
      mem_free(p_03);
      p_00->groups = (visuals_cycle_group **)0x0;
    }
    mem_free(p_00);
  }
  if (visuals_color_cycles_by_race != (anon_struct_24_3_6ed953bc *)0x0) {
    if (visuals_color_cycles_by_race->race != (visuals_color_cycle **)0x0) {
      mem_free(visuals_color_cycles_by_race->race);
      visuals_color_cycles_by_race->race = (visuals_color_cycle **)0x0;
    }
    mem_free(visuals_color_cycles_by_race);
    visuals_color_cycles_by_race = (anon_struct_24_3_6ed953bc *)0x0;
  }
  return;
}

Assistant:

static void ui_visuals_module_cleanup(void)
{
	visuals_flicker_free(visuals_flicker_table);
	visuals_cycler_free(visuals_cycler_table);

	if (visuals_color_cycles_by_race != NULL) {
		if (visuals_color_cycles_by_race->race != NULL) {
			mem_free(visuals_color_cycles_by_race->race);
			visuals_color_cycles_by_race->race = NULL;
		}

		mem_free(visuals_color_cycles_by_race);
		visuals_color_cycles_by_race = NULL;
	}
}